

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

bool __thiscall
deqp::sl::ShaderCase::checkPixels
          (ShaderCase *this,Surface *surface,int minX,int maxX,int minY,int maxY)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  if (maxY < minY) {
    bVar1 = true;
    bVar2 = false;
    bVar3 = true;
  }
  else {
    iVar5 = surface->m_width * minY;
    bVar3 = true;
    bVar2 = false;
    bVar1 = true;
    do {
      iVar6 = minX;
      if (minX <= maxX) {
        do {
          uVar4 = *(uint *)((long)(surface->m_pixels).m_ptr + (long)(iVar5 + iVar6) * 4) & 0xffffff;
          bVar3 = (bool)(bVar3 & uVar4 == 0xffffff);
          bVar1 = (bool)(bVar1 & uVar4 == 0);
          bVar2 = (bool)(bVar2 | (uVar4 != 0xffffff && uVar4 != 0));
          iVar6 = iVar6 + 1;
        } while (iVar6 <= maxX);
      }
      minY = minY + 1;
      iVar5 = iVar5 + surface->m_width;
    } while (minY <= maxY);
  }
  if (bVar3 == false) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
                 ,0x5a);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      if (bVar1) {
        return false;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
                 ,0x5b);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base(local_138);
  }
  return bVar3;
}

Assistant:

bool ShaderCase::checkPixels(Surface& surface, int minX, int maxX, int minY, int maxY)
{
	TestLog& log		   = m_testCtx.getLog();
	bool	 allWhite	  = true;
	bool	 allBlack	  = true;
	bool	 anyUnexpected = false;

	DE_ASSERT((maxX > minX) && (maxY > minY));

	for (int y = minY; y <= maxY; y++)
	{
		for (int x = minX; x <= maxX; x++)
		{
			RGBA pixel = surface.getPixel(x, y);
			// Note: we really do not want to involve alpha in the check comparison
			// \todo [2010-09-22 kalle] Do we know that alpha would be one? If yes, could use color constants white and black.
			bool isWhite = (pixel.getRed() == 255) && (pixel.getGreen() == 255) && (pixel.getBlue() == 255);
			bool isBlack = (pixel.getRed() == 0) && (pixel.getGreen() == 0) && (pixel.getBlue() == 0);

			allWhite	  = allWhite && isWhite;
			allBlack	  = allBlack && isBlack;
			anyUnexpected = anyUnexpected || (!isWhite && !isBlack);
		}
	}

	if (!allWhite)
	{
		if (anyUnexpected)
			log << TestLog::Message
				<< "WARNING: expecting all rendered pixels to be white or black, but got other colors as well!"
				<< TestLog::EndMessage;
		else if (!allBlack)
			log << TestLog::Message
				<< "WARNING: got inconsistent results over the image, when all pixels should be the same color!"
				<< TestLog::EndMessage;

		return false;
	}
	return true;
}